

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

void Frc_ManCollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,Vec_Int_t *vVisit)

{
  int v;
  Gia_Obj_t *pGVar1;
  int i;
  
  vSuper->nSize = 0;
  vVisit->nSize = 0;
  if (((uint)*(ulong *)pObj >> 0x1e & 1) != 0) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    Frc_ManCollectSuper_rec(p,pObj,vSuper,vVisit);
    pObj->field_0x3 = pObj->field_0x3 | 0x40;
    for (i = 0; i < vVisit->nSize; i = i + 1) {
      v = Vec_IntEntry(vVisit,i);
      pGVar1 = Gia_ManObj(p,v);
      pGVar1->field_0x7 = pGVar1->field_0x7 & 0xbf;
    }
    return;
  }
  __assert_fail("pObj->fMark0 == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaForce.c"
                ,0x126,
                "void Frc_ManCollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Frc_ManCollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, Vec_Int_t * vVisit )  
{
    int Entry, i;
    Vec_IntClear( vSuper );
    Vec_IntClear( vVisit );
    assert( pObj->fMark0 == 1 );
    pObj->fMark0 = 0;
    Frc_ManCollectSuper_rec( p, pObj, vSuper, vVisit );
    pObj->fMark0 = 1;
    Vec_IntForEachEntry( vVisit, Entry, i )
        Gia_ManObj(p, Entry)->fMark1 = 0;
}